

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

uint8_t bf_get_uint8(bfile_t *bfile)

{
  uint8_t uVar1;
  
  if (bfile->pos == bfile->size) {
    return '\0';
  }
  if (bfile->ipos == bfile->pos) {
    bf_read_buffer(bfile);
  }
  uVar1 = bfile->buffer[(int)(bfile->pos % (ulong)bfile->buffer_size)];
  bfile->pos = bfile->pos + 1;
  return uVar1;
}

Assistant:

uint8_t
bf_get_uint8(
    bfile_t * bfile )
{
    uint8_t val;
    uint8_t * buffer;
    int bufpos;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    if ( bf_at_eof( bfile ) != FALSE )
        return 0;

    if ( (bfile->ipos - bfile->pos) < 1 ) 
        bf_read_buffer( bfile );

    buffer = bfile->buffer;
    bufpos = bfile->pos % bfile->buffer_size;
    val = buffer[bufpos];
    bfile->pos++;
    return val;
}